

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

_Bool extent_commit_impl(tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,
                        extent_t *extent,size_t offset,size_t length,_Bool growing_retained)

{
  code *pcVar1;
  _Bool _Var2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  extent_t *in_RCX;
  long *in_RDX;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  byte in_stack_00000008;
  _Bool err;
  tsd_t *tsd;
  uint8_t state;
  extent_hooks_t **in_stack_ffffffffffffff38;
  arena_t *in_stack_ffffffffffffff40;
  byte local_b1;
  arena_t *in_stack_ffffffffffffff50;
  long lVar6;
  tsdn_t *in_stack_ffffffffffffff58;
  byte local_7b;
  witness_tsdn_t *local_38;
  
  if (in_RDI == 0) {
    local_38 = (witness_tsdn_t *)0x0;
  }
  else {
    local_38 = (witness_tsdn_t *)(in_RDI + 0x1838);
  }
  witness_assert_depth_to_rank(local_38,0xc,(uint)((in_stack_00000008 & 1) != 0));
  extent_hooks_assure_initialized(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((extent_hooks_t *)*in_RDX != &extent_hooks_default) {
    extent_hook_pre_reentrancy(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  local_7b = 1;
  if (*(long *)(*in_RDX + 0x18) != 0) {
    pcVar1 = *(code **)(*in_RDX + 0x18);
    lVar6 = *in_RDX;
    pvVar4 = extent_base_get(in_RCX);
    sVar5 = extent_size_get(in_RCX);
    uVar3 = arena_ind_get((arena_t *)0x168124);
    local_7b = (*pcVar1)(lVar6,pvVar4,sVar5,in_R8,in_R9,uVar3);
  }
  if ((extent_hooks_t *)*in_RDX != &extent_hooks_default) {
    extent_hook_post_reentrancy((tsdn_t *)in_stack_ffffffffffffff40);
  }
  _Var2 = extent_committed_get(in_RCX);
  local_b1 = 1;
  if (!_Var2) {
    local_b1 = local_7b & 1 ^ 0xff;
  }
  extent_committed_set(in_RCX,(_Bool)(local_b1 & 1));
  return (_Bool)(local_7b & 1);
}

Assistant:

static bool
extent_commit_impl(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent, size_t offset,
    size_t length, bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	bool err = ((*r_extent_hooks)->commit == NULL ||
	    (*r_extent_hooks)->commit(*r_extent_hooks, extent_base_get(extent),
	    extent_size_get(extent), offset, length, arena_ind_get(arena)));
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}
	extent_committed_set(extent, extent_committed_get(extent) || !err);
	return err;
}